

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O0

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessAnimation(MakeLeftHandedProcess *this,aiNodeAnim *pAnim)

{
  uint local_20;
  uint local_1c;
  uint a_1;
  uint a;
  aiNodeAnim *pAnim_local;
  MakeLeftHandedProcess *this_local;
  
  for (local_1c = 0; local_1c < pAnim->mNumPositionKeys; local_1c = local_1c + 1) {
    pAnim->mPositionKeys[local_1c].mValue.z = pAnim->mPositionKeys[local_1c].mValue.z * -1.0;
  }
  for (local_20 = 0; local_20 < pAnim->mNumRotationKeys; local_20 = local_20 + 1) {
    pAnim->mRotationKeys[local_20].mValue.x = pAnim->mRotationKeys[local_20].mValue.x * -1.0;
    pAnim->mRotationKeys[local_20].mValue.y = pAnim->mRotationKeys[local_20].mValue.y * -1.0;
  }
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessAnimation( aiNodeAnim* pAnim)
{
    // position keys
    for( unsigned int a = 0; a < pAnim->mNumPositionKeys; a++)
        pAnim->mPositionKeys[a].mValue.z *= -1.0f;

    // rotation keys
    for( unsigned int a = 0; a < pAnim->mNumRotationKeys; a++)
    {
        /* That's the safe version, but the float errors add up. So we try the short version instead
        aiMatrix3x3 rotmat = pAnim->mRotationKeys[a].mValue.GetMatrix();
        rotmat.a3 = -rotmat.a3; rotmat.b3 = -rotmat.b3;
        rotmat.c1 = -rotmat.c1; rotmat.c2 = -rotmat.c2;
        aiQuaternion rotquat( rotmat);
        pAnim->mRotationKeys[a].mValue = rotquat;
        */
        pAnim->mRotationKeys[a].mValue.x *= -1.0f;
        pAnim->mRotationKeys[a].mValue.y *= -1.0f;
    }
}